

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC,int is)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  
  uVar2 = 0xffffffd7;
  if ((0 < is) && (is < MRIC->stages)) {
    if ((MRIC->G == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
      bVar1 = false;
    }
    else {
      dVar4 = 0.0;
      lVar3 = 0;
      do {
        dVar4 = dVar4 + ABS(MRIC->G[lVar3][(uint)is][(uint)is]);
        lVar3 = lVar3 + 1;
      } while (MRIC->nmat != lVar3);
      bVar1 = 2.220446049250313e-14 < dVar4;
    }
    dVar4 = MRIC->c[(uint)is] - MRIC->c[(ulong)(uint)is - 1];
    if (bVar1) {
      return 2.220446049250313e-14 < dVar4 | 2;
    }
    uVar2 = (uint)(dVar4 <= 2.220446049250313e-14);
  }
  return uVar2;
}

Assistant:

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC, int is)
{
  int i;
  sunrealtype Gabs, cdiff;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  if ((is < 1) || (is >= MRIC->stages)) { return ARK_INVALID_TABLE; }

  /* sum of stage diagonal entries across implicit tables */
  Gabs = ZERO;
  if (MRIC->G)
  {
    for (i = 0; i < MRIC->nmat; i++) { Gabs += SUNRabs(MRIC->G[i][is][is]); }
  }

  /* abscissae difference */
  cdiff = MRIC->c[is] - MRIC->c[is - 1];

  if (Gabs > tol)
  { /* DIRK */
    if (cdiff > tol)
    { /* Fast */
      return (MRISTAGE_DIRK_FAST);
    }
    else { return (MRISTAGE_DIRK_NOFAST); }
  }
  else
  { /* ERK */
    if (cdiff > tol)
    { /* Fast */
      return (MRISTAGE_ERK_FAST);
    }
    else { return (MRISTAGE_ERK_NOFAST); }
  }
}